

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::LoadStringConstant(VirtualMachine *this)

{
  element_type *peVar1;
  pointer pbVar2;
  element_type *peVar3;
  size_t sVar4;
  Variable v;
  string local_40;
  
  sVar4 = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pbVar2 = (peVar1->stringConstants).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar4 < (ulong)((long)(peVar1->stringConstants).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    v.field_1 = (anon_union_8_6_52c89740_for_Variable_1)(pbVar2 + sVar4);
    v._0_8_ = 4;
    pushOpStack(this,v);
    peVar3 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->programCounter = peVar3->programCounter + 1;
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Index out of bounds in LoadStringConstant","");
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::LoadStringConstant() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->stringConstants.size()) {
    this->panic("Index out of bounds in LoadStringConstant");
    return;
  }

  this->pushString(&this->file->stringConstants.at(index));

  this->advance();
}